

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

QString * __thiscall
QWidgetLineControl::stripString
          (QString *__return_storage_ptr__,QWidgetLineControl *this,QString *str)

{
  Data *pDVar1;
  uint uVar2;
  ulong uVar3;
  
  if (*(long *)(this + 0xe8) == 0) {
    pDVar1 = (str->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (str->d).ptr;
    (__return_storage_ptr__->d).size = (str->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    uVar2 = (uint)(str->d).size;
    if ((int)*(uint *)(this + 0x60) < (int)uVar2) {
      uVar2 = *(uint *)(this + 0x60);
    }
    if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        if (*(long *)(this + 0xe8) == 0) {
          stripString();
        }
        if ((*(char *)(*(long *)(this + 0xe8) + 2 + uVar3 * 8) == '\x01') ||
           ((str->d).ptr[uVar3] != *(char16_t *)(this + 0xe0))) {
          QString::append((QChar)(char16_t)__return_storage_ptr__);
        }
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QWidgetLineControl::stripString(const QString &str) const
{
    if (!m_maskData)
        return str;

    QString s;
    int end = qMin(m_maxLength, (int)str.size());
    for (int i = 0; i < end; ++i)
        if (m_maskData[i].separator)
            s += m_maskData[i].maskChar;
        else
            if (str[i] != m_blank)
                s += str[i];

    return s;
}